

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_traits.h
# Opt level: O1

void cppcms::
     archive_traits<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_void>
     ::save(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
            *d,archive *a)

{
  pointer piVar1;
  pointer piVar2;
  
  cppcms::archive::write_chunk(a,(ulong)(d->first)._M_dataplus._M_p);
  piVar1 = (d->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  piVar2 = (pointer)0x0;
  if ((d->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    piVar2 = piVar1;
  }
  cppcms::archive::write_chunk(a,(ulong)piVar2);
  return;
}

Assistant:

static void save(std::pair<F,S> const &d,archive &a)
		{
			archive_traits<F>::save(d.first,a);
			archive_traits<S>::save(d.second,a);
		}